

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

void __thiscall QFontCache::clear(QFontCache *this)

{
  EngineDataCache *this_00;
  EngineCache *this_01;
  QAtomicInt *pQVar1;
  uchar *puVar2;
  QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
  *pQVar3;
  QFontEngineData *this_02;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_header *p_Var5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QFontEngine *engine;
  QFontEngine *local_58;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->engineDataCache;
  QMap<QFontDef,_QFontEngineData_*>::detach(this_00);
  p_Var4 = (((this->engineDataCache).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  QMap<QFontDef,_QFontEngineData_*>::detach(this_00);
  pQVar3 = (this->engineDataCache).d.d.ptr;
  for (; (_Rb_tree_header *)p_Var4 != &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    this_02 = (QFontEngineData *)p_Var4[4]._M_parent;
    lVar6 = 1;
    do {
      if (this_02->engines[lVar6 + -1] != (QFontEngine *)0x0) {
        LOCK();
        pQVar1 = &this_02->engines[lVar6 + -1]->ref;
        (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           (this_02->engines[lVar6 + -1] != (QFontEngine *)0x0)) {
          (*this_02->engines[lVar6 + -1]->_vptr_QFontEngine[1])();
        }
        this_02->engines[lVar6 + -1] = (QFontEngine *)0x0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xad);
    LOCK();
    (this_02->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (this_02->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((this_02->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      QFontEngineData::~QFontEngineData(this_02);
      operator_delete(this_02,0x568);
    }
  }
  QMap<QFontDef,_QFontEngineData_*>::clear(this_00);
  this_01 = &this->engineCache;
  do {
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::detach(this_01);
    p_Var4 = (((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::detach(this_01);
    p_Var5 = &(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 == p_Var5) break;
    bVar7 = false;
    do {
      local_58 = (QFontEngine *)p_Var4[4]._M_left;
      if (local_58 != (QFontEngine *)0x0) {
        QHash<QFontEngine*,int>::tryEmplace_impl<QFontEngine*const&>
                  (&local_50,(QHash<QFontEngine*,int> *)&this->engineCacheCount,&local_58);
        puVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries
                 [(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                  [(uint)local_50.iterator.i.bucket & 0x7f]].storage.data + 8;
        *(int *)puVar2 = *(int *)puVar2 + -1;
        LOCK();
        pQVar1 = &local_58->ref;
        (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           (bVar7 = local_58->m_type == 1, local_58 != (QFontEngine *)0x0)) {
          (*local_58->_vptr_QFontEngine[1])();
        }
        p_Var4[4]._M_left = (_Base_ptr)0x0;
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  } while (bVar7);
  QMultiMap<QFontCache::Key,_QFontCache::Engine>::clear(this_01);
  QHash<QFontEngine_*,_int>::clear(&this->engineCacheCount);
  this->total_cost = 0;
  this->max_cost = 0x1000;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontCache::clear()
{
    {
        EngineDataCache::Iterator it = engineDataCache.begin(),
                                 end = engineDataCache.end();
        while (it != end) {
            QFontEngineData *data = it.value();
            for (int i = 0; i < QFontDatabasePrivate::ScriptCount; ++i) {
                if (data->engines[i]) {
                    if (!data->engines[i]->ref.deref()) {
                        Q_ASSERT(engineCacheCount.value(data->engines[i]) == 0);
                        delete data->engines[i];
                    }
                    data->engines[i] = nullptr;
                }
            }
            if (!data->ref.deref()) {
                delete data;
            } else {
                FC_DEBUG("QFontCache::clear: engineData %p still has refcount %d",
                         data, data->ref.loadRelaxed());
            }
            ++it;
        }
    }

    engineDataCache.clear();


    bool mightHaveEnginesLeftForCleanup;
    do {
        mightHaveEnginesLeftForCleanup = false;
        for (EngineCache::Iterator it = engineCache.begin(), end = engineCache.end();
             it != end; ++it) {
            QFontEngine *engine = it.value().data;
            if (engine) {
                const int cacheCount = --engineCacheCount[engine];
                Q_ASSERT(cacheCount >= 0);
                if (!engine->ref.deref()) {
                    Q_ASSERT(cacheCount == 0);
                    mightHaveEnginesLeftForCleanup = engine->type() == QFontEngine::Multi;
                    delete engine;
                } else if (cacheCount == 0) {
                    FC_DEBUG("QFontCache::clear: engine %p still has refcount %d",
                             engine, engine->ref.loadRelaxed());
                }
                it.value().data = nullptr;
            }
        }
    } while (mightHaveEnginesLeftForCleanup);

    engineCache.clear();
    engineCacheCount.clear();


    total_cost = 0;
    max_cost = min_cost;
}